

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariable.cpp
# Opt level: O0

void __thiscall rsg::Variable::~Variable(Variable *this)

{
  Variable *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_name);
  VariableType::~VariableType(&this->m_type);
  return;
}

Assistant:

Variable::~Variable (void)
{
}